

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int VP8LEncodeImage(WebPConfig *config,WebPPicture *picture)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  WebPPicture *in_RSI;
  long in_RDI;
  int mb_h;
  int mb_w;
  WebPAuxStats *stats;
  VP8LBitWriter bw;
  WebPEncodingError err;
  int initial_size;
  int percent;
  size_t coded_size;
  int has_alpha;
  int height;
  int width;
  int in_stack_0000044c;
  VP8LBitWriter *in_stack_00000450;
  WebPPicture *in_stack_00000458;
  WebPConfig *in_stack_00000460;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  WebPPicture *in_stack_ffffffffffffff88;
  size_t *in_stack_ffffffffffffffa8;
  VP8LBitWriter *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  WebPEncodingError local_3c;
  int local_30;
  uint local_4;
  
  if (in_RSI == (WebPPicture *)0x0) {
    return 0;
  }
  if ((in_RDI == 0) || (in_RSI->argb == (uint32_t *)0x0)) {
    WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_NULL_PARAMETER);
    return 0;
  }
  iVar1 = in_RSI->width;
  iVar2 = in_RSI->height;
  if (*(int *)(in_RDI + 0xc) == 3) {
    iVar3 = iVar1 * iVar2;
  }
  else {
    iVar3 = iVar1 * iVar2 * 2;
  }
  iVar4 = VP8LBitWriterInit((VP8LBitWriter *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            CONCAT44(iVar3,in_stack_ffffffffffffff78));
  if (iVar4 == 0) {
    local_3c = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto LAB_0017450f;
  }
  iVar4 = WebPReportProgress(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                             (int *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
  if (iVar4 != 0) {
    if (in_RSI->stats != (WebPAuxStats *)0x0) {
      in_stack_ffffffffffffff88 = (WebPPicture *)in_RSI->stats;
      memset(in_stack_ffffffffffffff88,0,0xbc);
      in_stack_ffffffffffffff88->colorspace = 0x42c60000;
      in_stack_ffffffffffffff88->width = 0x42c60000;
      in_stack_ffffffffffffff88->height = 0x42c60000;
      *(undefined4 *)&in_stack_ffffffffffffff88->y = 0x42c60000;
      *(float *)((long)&in_stack_ffffffffffffff88->y + 4) = 99.0;
    }
    iVar4 = WriteImageSize((WebPPicture *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (VP8LBitWriter *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
    if (iVar4 == 0) {
      local_3c = VP8_ENC_ERROR_OUT_OF_MEMORY;
      goto LAB_0017450f;
    }
    WebPPictureHasTransparency((WebPPicture *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
    iVar4 = WriteRealAlphaAndVersion
                      ((VP8LBitWriter *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar3);
    if (iVar4 == 0) {
      local_3c = VP8_ENC_ERROR_OUT_OF_MEMORY;
      goto LAB_0017450f;
    }
    iVar4 = WebPReportProgress(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                               (int *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
    if (iVar4 != 0) {
      local_3c = VP8LEncodeStream(in_stack_00000460,in_stack_00000458,in_stack_00000450,
                                  in_stack_0000044c);
      if (local_3c != VP8_ENC_OK) goto LAB_0017450f;
      iVar4 = WebPReportProgress(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                 (int *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
      if (iVar4 != 0) {
        local_3c = WriteImage((WebPPicture *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        if (local_3c != VP8_ENC_OK) goto LAB_0017450f;
        iVar3 = WebPReportProgress(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                   (int *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
        if (iVar3 != 0) {
          if (in_RSI->stats != (WebPAuxStats *)0x0) {
            in_RSI->stats->coded_size = local_30 + in_RSI->stats->coded_size;
            in_RSI->stats->lossless_size = local_30;
          }
          if (in_RSI->extra_info != (uint8_t *)0x0) {
            memset(in_RSI->extra_info,0,(long)((iVar1 + 0xf >> 4) * (iVar2 + 0xf >> 4)));
          }
          goto LAB_0017450f;
        }
      }
    }
  }
  local_3c = VP8_ENC_ERROR_USER_ABORT;
LAB_0017450f:
  if (in_stack_ffffffffffffffb8 != 0) {
    local_3c = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  VP8LBitWriterWipeOut((VP8LBitWriter *)0x174528);
  if (local_3c != VP8_ENC_OK) {
    WebPEncodingSetError(in_RSI,local_3c);
  }
  local_4 = (uint)(local_3c == VP8_ENC_OK);
  return local_4;
}

Assistant:

int VP8LEncodeImage(const WebPConfig* const config,
                    const WebPPicture* const picture) {
  int width, height;
  int has_alpha;
  size_t coded_size;
  int percent = 0;
  int initial_size;
  WebPEncodingError err = VP8_ENC_OK;
  VP8LBitWriter bw;

  if (picture == NULL) return 0;

  if (config == NULL || picture->argb == NULL) {
    err = VP8_ENC_ERROR_NULL_PARAMETER;
    WebPEncodingSetError(picture, err);
    return 0;
  }

  width = picture->width;
  height = picture->height;
  // Initialize BitWriter with size corresponding to 16 bpp to photo images and
  // 8 bpp for graphical images.
  initial_size = (config->image_hint == WEBP_HINT_GRAPH) ?
      width * height : width * height * 2;
  if (!VP8LBitWriterInit(&bw, initial_size)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  if (!WebPReportProgress(picture, 1, &percent)) {
 UserAbort:
    err = VP8_ENC_ERROR_USER_ABORT;
    goto Error;
  }
  // Reset stats (for pure lossless coding)
  if (picture->stats != NULL) {
    WebPAuxStats* const stats = picture->stats;
    memset(stats, 0, sizeof(*stats));
    stats->PSNR[0] = 99.f;
    stats->PSNR[1] = 99.f;
    stats->PSNR[2] = 99.f;
    stats->PSNR[3] = 99.f;
    stats->PSNR[4] = 99.f;
  }

  // Write image size.
  if (!WriteImageSize(picture, &bw)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  has_alpha = WebPPictureHasTransparency(picture);
  // Write the non-trivial Alpha flag and lossless version.
  if (!WriteRealAlphaAndVersion(&bw, has_alpha)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  if (!WebPReportProgress(picture, 5, &percent)) goto UserAbort;

  // Encode main image stream.
  err = VP8LEncodeStream(config, picture, &bw, 1 /*use_cache*/);
  if (err != VP8_ENC_OK) goto Error;

  if (!WebPReportProgress(picture, 90, &percent)) goto UserAbort;

  // Finish the RIFF chunk.
  err = WriteImage(picture, &bw, &coded_size);
  if (err != VP8_ENC_OK) goto Error;

  if (!WebPReportProgress(picture, 100, &percent)) goto UserAbort;

#if !defined(WEBP_DISABLE_STATS)
  // Save size.
  if (picture->stats != NULL) {
    picture->stats->coded_size += (int)coded_size;
    picture->stats->lossless_size = (int)coded_size;
  }
#endif

  if (picture->extra_info != NULL) {
    const int mb_w = (width + 15) >> 4;
    const int mb_h = (height + 15) >> 4;
    memset(picture->extra_info, 0, mb_w * mb_h * sizeof(*picture->extra_info));
  }

 Error:
  if (bw.error_) err = VP8_ENC_ERROR_OUT_OF_MEMORY;
  VP8LBitWriterWipeOut(&bw);
  if (err != VP8_ENC_OK) {
    WebPEncodingSetError(picture, err);
    return 0;
  }
  return 1;
}